

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this)

{
  pointer paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  bool bVar4;
  secp256k1_context_struct *context;
  pointer paVar5;
  char *pcVar6;
  ByteData actual_mul;
  AssertionResult gtest_ar_1;
  Secp256k1 secp;
  ByteData actual_add;
  TweakPrivkeyTestVector test_vector;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  size_type sStack_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  Secp256k1 local_c8;
  ByteData local_c0;
  AssertHelper local_a8;
  anon_struct_112_4_5aca4469 local_a0;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_c8,context);
  paVar1 = tweak_privkey_test_vectors.
           super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (tweak_privkey_test_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      tweak_privkey_test_vectors.
      super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar5 = tweak_privkey_test_vectors.
             super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      anon_struct_112_4_5aca4469::TweakPrivkeyTestVector(&local_a0,paVar5);
      cfd::core::ByteData::ByteData(&local_c0);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec
                    ((ByteData *)&local_118,&local_c8,&local_a0.privkey,&local_a0.tweak);
          puVar3 = local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_118._M_dataplus._M_p;
          local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_118._M_string_length;
          local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_118.field_2._M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar3 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(puVar3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_118._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x15e,
                   "Expected: actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
          }
          local_118._M_dataplus._M_p = (pointer)0x0;
        }
      }
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_118,&local_c0);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&local_f0,"test_vector.expect_add","actual_add.GetHex()",
                 &local_a0.expect_add,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_f0._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_118);
        pcVar6 = "";
        if (local_e8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_e8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x15f,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
          }
          local_118._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::ByteData::ByteData((ByteData *)&local_f0);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
                    ((ByteData *)&local_118,&local_c8,&local_a0.privkey,&local_a0.tweak);
          paVar2 = local_f0;
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_118._M_dataplus._M_p;
          local_e8.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_118._M_string_length;
          sStack_e0 = local_118.field_2._M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity = 0;
          if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
            operator_delete(paVar2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_118._M_dataplus._M_p);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x164,
                   "Expected: actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
          }
          local_118._M_dataplus._M_p = (pointer)0x0;
        }
      }
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_118,(ByteData *)&local_f0);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                (local_d8,"test_vector.expect_mul","actual_mul.GetHex()",&local_a0.expect_mul,
                 &local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_118);
        pcVar6 = "";
        if (local_d0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
                   ,0x165,pcVar6);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_118._M_dataplus._M_p + 8))();
          }
          local_118._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_f0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.expect_mul._M_dataplus._M_p != &local_a0.expect_mul.field_2) {
        operator_delete(local_a0.expect_mul._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.expect_add._M_dataplus._M_p != &local_a0.expect_add.field_2) {
        operator_delete(local_a0.expect_add._M_dataplus._M_p);
      }
      if (local_a0.tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.tweak.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a0.privkey.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.privkey.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      paVar5 = paVar5 + 1;
    } while (paVar5 != paVar1);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_test_vectors) {
    ByteData actual_add;
    EXPECT_NO_THROW(
        actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_add, actual_add.GetHex());

    ByteData actual_mul;
    EXPECT_NO_THROW(
        actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_mul, actual_mul.GetHex());
  }
}